

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::definePrimitive(Forth *this,char *name,Code code,bool setImmediate)

{
  bool bVar1;
  char cVar2;
  reference pcVar3;
  size_type sVar4;
  Definition *pDVar5;
  undefined7 in_register_00000009;
  byte in_R8B;
  Definition *lastDefinition;
  char *c;
  iterator __end2;
  iterator __begin2;
  string *__range2;
  undefined1 local_90 [8];
  Definition defn;
  bool setImmediate_local;
  Code code_local;
  char *name_local;
  Forth *this_local;
  
  defn.FlagImmediate._3_1_ = in_R8B & 1;
  alignDataPointer(this);
  Definition::Definition((Definition *)local_90);
  local_90 = (undefined1  [8])code;
  defn.code = CONCAT71(in_register_00000009,setImmediate);
  defn._8_4_ = getDataPointer(this);
  defn._12_4_ = defn._8_4_;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&defn.flags,name);
  __end2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &defn.flags);
  c = (char *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &defn.flags);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      (&__end2,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&c);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    pcVar3 = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end2);
    cVar2 = toupper_ascii(*pcVar3);
    *pcVar3 = cVar2;
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end2);
  }
  std::vector<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>::
  emplace_back<cppforth::Forth::Definition>(&this->definitions,(Definition *)local_90);
  sVar4 = std::vector<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>::
          size(&this->definitions);
  pDVar5 = getDefinition(this,(int)sVar4 - 1);
  sVar4 = std::vector<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>::
          size(&this->definitions);
  pDVar5->numberInVector = (int)sVar4 - 1;
  pDVar5->searchOrder = this->searchOrderCurrent;
  if ((defn.FlagImmediate._3_1_ & 1) != 0) {
    immediate(this);
  }
  Definition::~Definition((Definition *)local_90);
  return;
}

Assistant:

void definePrimitive(const char* name, Code code, bool setImmediate) {
			alignDataPointer();

			Definition defn;
			defn.code = code;
			defn.parameter = defn.does = AADDR(getDataPointer());
			defn.name = name;
			for (auto & c: defn.name) c = toupper_ascii(static_cast<unsigned char>(c));
			definitions.emplace_back(std::move(defn));
			auto lastDefinition=getDefinition(CELL(definitions.size()) - 1);
			lastDefinition->numberInVector = CELL(definitions.size()) - 1;
			lastDefinition->searchOrder=searchOrderCurrent;
			if (setImmediate) immediate();
		}